

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O2

void FastPForLib::Simple9<true,_false>::unpack0_28(uint32_t **out,uint32_t **in)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  int k;
  long lVar3;
  
  puVar1 = *out;
  puVar2 = *in;
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 1) {
    puVar1[lVar3] = 0;
  }
  *in = puVar2 + 1;
  *out = puVar1 + 0x1c;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack0_28(uint32_t **out,
                                             const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;
  for (int k = 0; k < 28; ++k)
    pout[k] = 0;
  *in = pin + 1;
  *out = pout + 28;
}